

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channeluser.c
# Opt level: O3

_Bool chirc_channeluser_get_or_create
                (chirc_channel_t *channel,chirc_user_t *user,chirc_channeluser_t **channeluser)

{
  UT_hash_bucket *pUVar1;
  UT_hash_handle *pUVar2;
  UT_hash_handle *pUVar3;
  uchar *_hj_key;
  chirc_channeluser_t *pcVar4;
  UT_hash_bucket *pUVar6;
  ulong uVar7;
  UT_hash_table *pUVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  UT_hash_handle *pUVar5;
  
  *channeluser = (chirc_channeluser_t *)0x0;
  if ((channel->users != (chirc_channeluser_t *)0x0) &&
     (channel->users != (chirc_channeluser_t *)0x0)) {
    uVar9 = (uint)user;
    iVar10 = (int)((ulong)user >> 0x20) + -0x61c88647;
    uVar12 = (uVar9 & 0xff) +
             ((uVar9 & 0xff000000) - iVar10) + (uVar9 & 0xff00) + (uVar9 & 0xff0000) + 0x9f49bac2 ^
             0x7f76d;
    uVar9 = uVar12 << 8 ^ (iVar10 - uVar12) + 0x1124109;
    uVar11 = uVar9 >> 0xd ^ (-0x1124109 - uVar12) - uVar9;
    uVar12 = uVar11 >> 0xc ^ (uVar12 - uVar9) - uVar11;
    uVar9 = uVar12 << 0x10 ^ (uVar9 - uVar11) - uVar12;
    uVar13 = uVar9 >> 5 ^ (uVar11 - uVar12) - uVar9;
    uVar11 = uVar13 >> 3 ^ (uVar12 - uVar9) - uVar13;
    uVar9 = uVar11 << 10 ^ (uVar9 - uVar13) - uVar11;
    uVar9 = uVar9 >> 0xf ^ uVar13 - (uVar11 + uVar9);
    pUVar8 = (channel->users->hh_from_channel).tbl;
    pUVar5 = pUVar8->buckets[pUVar8->num_buckets - 1 & uVar9].hh_head;
    if (pUVar5 != (UT_hash_handle *)0x0) {
      while( true ) {
        pcVar4 = (chirc_channeluser_t *)((long)pUVar5 - pUVar8->hho);
        *channeluser = pcVar4;
        if ((((pcVar4->hh_from_channel).hashv == uVar9) && ((pcVar4->hh_from_channel).keylen == 8))
           && (*(pcVar4->hh_from_channel).key == user)) {
          return false;
        }
        pUVar5 = (pcVar4->hh_from_channel).hh_next;
        if (pUVar5 == (UT_hash_handle *)0x0) break;
        pUVar8 = (channel->users->hh_from_channel).tbl;
      }
    }
  }
  pcVar4 = (chirc_channeluser_t *)malloc(0x90);
  *channeluser = pcVar4;
  pcVar4->modes[0] = '\0';
  pcVar4->channel = channel;
  pcVar4->user = user;
  iVar10 = (int)((ulong)channel >> 0x20) + -0x61c88647;
  uVar9 = (uint)channel;
  uVar12 = (uVar9 & 0xff) + ((uVar9 & 0xff000000) - iVar10) + (uVar9 & 0xff00) + (uVar9 & 0xff0000)
           + 0x9f49bac2 ^ 0x7f76d;
  uVar11 = uVar12 << 8 ^ (iVar10 - uVar12) + 0x1124109;
  uVar9 = uVar11 >> 0xd ^ (-0x1124109 - uVar12) - uVar11;
  uVar13 = uVar9 >> 0xc ^ (uVar12 - uVar11) - uVar9;
  uVar12 = uVar13 << 0x10 ^ (uVar11 - uVar9) - uVar13;
  uVar11 = uVar12 >> 5 ^ (uVar9 - uVar13) - uVar12;
  uVar9 = uVar11 >> 3 ^ (uVar13 - uVar12) - uVar11;
  uVar12 = uVar9 << 10 ^ (uVar12 - uVar11) - uVar9;
  uVar9 = uVar12 >> 0xf ^ uVar11 - (uVar9 + uVar12);
  (pcVar4->hh_from_user).hashv = uVar9;
  (pcVar4->hh_from_user).key = &pcVar4->channel;
  (pcVar4->hh_from_user).keylen = 8;
  if (user->channels == (chirc_channeluser_t *)0x0) {
    pUVar8 = (UT_hash_table *)calloc(1,0x40);
    (pcVar4->hh_from_user).prev = (void *)0x0;
    (pcVar4->hh_from_user).next = (void *)0x0;
    (pcVar4->hh_from_user).tbl = pUVar8;
    if (pUVar8 == (UT_hash_table *)0x0) goto LAB_00102dcf;
    pUVar8->tail = &pcVar4->hh_from_user;
    pUVar8->num_buckets = 0x20;
    pUVar8->log2_num_buckets = 5;
    pUVar8->hho = 0x20;
    pUVar6 = (UT_hash_bucket *)calloc(1,0x200);
    pUVar8->buckets = pUVar6;
    pUVar8->signature = 0xa0111fe1;
    if (pUVar6 == (UT_hash_bucket *)0x0) goto LAB_00102dcf;
    user->channels = pcVar4;
    uVar11 = 0x1f;
  }
  else {
    pUVar8 = (user->channels->hh_from_user).tbl;
    (pcVar4->hh_from_user).tbl = pUVar8;
    (pcVar4->hh_from_user).next = (void *)0x0;
    pUVar5 = pUVar8->tail;
    (pcVar4->hh_from_user).prev = (void *)((long)pUVar5 - pUVar8->hho);
    pUVar5->next = pcVar4;
    pUVar8->tail = &(*channeluser)->hh_from_user;
    pUVar6 = pUVar8->buckets;
    uVar11 = pUVar8->num_buckets - 1;
  }
  pUVar8->num_items = pUVar8->num_items + 1;
  uVar11 = uVar11 & uVar9;
  uVar9 = pUVar6[uVar11].count + 1;
  pUVar6[uVar11].count = uVar9;
  pUVar5 = pUVar6[uVar11].hh_head;
  ((*channeluser)->hh_from_user).hh_next = pUVar5;
  ((*channeluser)->hh_from_user).hh_prev = (UT_hash_handle *)0x0;
  if (pUVar5 != (UT_hash_handle *)0x0) {
    pUVar5->hh_prev = &(*channeluser)->hh_from_user;
  }
  pUVar6[uVar11].hh_head = &(*channeluser)->hh_from_user;
  pcVar4 = *channeluser;
  if ((pUVar6[uVar11].expand_mult * 10 + 10 <= uVar9) &&
     (pUVar8 = (pcVar4->hh_from_user).tbl, pUVar8->noexpand == 0)) {
    pUVar6 = (UT_hash_bucket *)calloc(1,(ulong)pUVar8->num_buckets << 5);
    if (pUVar6 == (UT_hash_bucket *)0x0) goto LAB_00102dcf;
    pUVar8 = (pcVar4->hh_from_user).tbl;
    pUVar8->ideal_chain_maxlen =
         ((pUVar8->num_items >> ((char)pUVar8->log2_num_buckets + 1U & 0x1f)) + 1) -
         (uint)((pUVar8->num_buckets * 2 - 1 & pUVar8->num_items) == 0);
    pUVar8->nonideal_items = 0;
    if (pUVar8->num_buckets != 0) {
      uVar7 = 0;
      do {
        pUVar5 = pUVar8->buckets[uVar7].hh_head;
        if (pUVar5 != (UT_hash_handle *)0x0) {
          do {
            pUVar8 = ((*channeluser)->hh_from_user).tbl;
            uVar11 = pUVar8->num_buckets * 2 - 1 & pUVar5->hashv;
            pUVar2 = pUVar5->hh_next;
            pUVar1 = pUVar6 + uVar11;
            uVar9 = pUVar6[uVar11].count + 1;
            pUVar6[uVar11].count = uVar9;
            if (pUVar8->ideal_chain_maxlen < uVar9) {
              pUVar8->nonideal_items = pUVar8->nonideal_items + 1;
              if (pUVar8->ideal_chain_maxlen * pUVar1->expand_mult < uVar9) {
                pUVar1->expand_mult = pUVar1->expand_mult + 1;
              }
            }
            pUVar5->hh_prev = (UT_hash_handle *)0x0;
            pUVar3 = pUVar1->hh_head;
            pUVar5->hh_next = pUVar3;
            if (pUVar3 != (UT_hash_handle *)0x0) {
              pUVar3->hh_prev = pUVar5;
            }
            pUVar1->hh_head = pUVar5;
            pUVar5 = pUVar2;
          } while (pUVar2 != (UT_hash_handle *)0x0);
          pcVar4 = *channeluser;
        }
        uVar7 = uVar7 + 1;
        pUVar8 = (pcVar4->hh_from_user).tbl;
      } while (uVar7 < pUVar8->num_buckets);
    }
    free(pUVar8->buckets);
    pUVar8 = ((*channeluser)->hh_from_user).tbl;
    pUVar8->num_buckets = pUVar8->num_buckets << 1;
    pUVar8->log2_num_buckets = pUVar8->log2_num_buckets + 1;
    pUVar8->buckets = pUVar6;
    pcVar4 = *channeluser;
    pUVar8 = (pcVar4->hh_from_user).tbl;
    if (pUVar8->num_items >> 1 < pUVar8->nonideal_items) {
      uVar9 = pUVar8->ineff_expands + 1;
      pUVar8->ineff_expands = uVar9;
      if (1 < uVar9) {
        pUVar8->noexpand = 1;
      }
    }
    else {
      pUVar8->ineff_expands = 0;
    }
  }
  iVar10 = *(int *)((long)&pcVar4->user + 4) + -0x61c88647;
  uVar12 = (uint)*(byte *)&pcVar4->user +
           ((uint)*(byte *)((long)&pcVar4->user + 3) * 0x1000000 - iVar10) +
           (uint)*(byte *)((long)&pcVar4->user + 1) * 0x100 +
           (uint)*(byte *)((long)&pcVar4->user + 2) * 0x10000 + 0x9f49bac2 ^ 0x7f76d;
  uVar11 = uVar12 << 8 ^ (iVar10 - uVar12) + 0x1124109;
  uVar9 = uVar11 >> 0xd ^ (-0x1124109 - uVar12) - uVar11;
  uVar13 = uVar9 >> 0xc ^ (uVar12 - uVar11) - uVar9;
  uVar12 = uVar13 << 0x10 ^ (uVar11 - uVar9) - uVar13;
  uVar11 = uVar12 >> 5 ^ (uVar9 - uVar13) - uVar12;
  uVar9 = uVar11 >> 3 ^ (uVar13 - uVar12) - uVar11;
  uVar12 = uVar9 << 10 ^ (uVar12 - uVar11) - uVar9;
  uVar9 = uVar12 >> 0xf ^ uVar11 - (uVar9 + uVar12);
  (pcVar4->hh_from_channel).hashv = uVar9;
  (pcVar4->hh_from_channel).key = pcVar4;
  pcVar4 = *channeluser;
  (pcVar4->hh_from_channel).keylen = 8;
  if (channel->users == (chirc_channeluser_t *)0x0) {
    (pcVar4->hh_from_channel).next = (void *)0x0;
    ((*channeluser)->hh_from_channel).prev = (void *)0x0;
    pUVar8 = (UT_hash_table *)malloc(0x40);
    ((*channeluser)->hh_from_channel).tbl = pUVar8;
    pUVar8 = ((*channeluser)->hh_from_channel).tbl;
    if (pUVar8 == (UT_hash_table *)0x0) goto LAB_00102dcf;
    pUVar8->ineff_expands = 0;
    pUVar8->noexpand = 0;
    *(undefined8 *)&pUVar8->signature = 0;
    pUVar8->hho = 0;
    pUVar8->ideal_chain_maxlen = 0;
    pUVar8->nonideal_items = 0;
    *(undefined8 *)&pUVar8->num_items = 0;
    pUVar8->tail = (UT_hash_handle *)0x0;
    pUVar8->buckets = (UT_hash_bucket *)0x0;
    pUVar8->num_buckets = 0;
    pUVar8->log2_num_buckets = 0;
    (((*channeluser)->hh_from_channel).tbl)->tail = &(*channeluser)->hh_from_channel;
    pUVar8 = ((*channeluser)->hh_from_channel).tbl;
    pUVar8->num_buckets = 0x20;
    pUVar8->log2_num_buckets = 5;
    pUVar8->hho = 0x58;
    pUVar6 = (UT_hash_bucket *)malloc(0x200);
    pUVar8->buckets = pUVar6;
    pUVar8 = ((*channeluser)->hh_from_channel).tbl;
    pUVar8->signature = 0xa0111fe1;
    pUVar6 = pUVar8->buckets;
    if (pUVar6 == (UT_hash_bucket *)0x0) goto LAB_00102dcf;
    memset(pUVar6,0,0x200);
    pcVar4 = *channeluser;
    channel->users = pcVar4;
    pUVar8 = (pcVar4->hh_from_channel).tbl;
  }
  else {
    pUVar8 = (channel->users->hh_from_channel).tbl;
    (pcVar4->hh_from_channel).tbl = pUVar8;
    ((*channeluser)->hh_from_channel).next = (void *)0x0;
    pUVar5 = pUVar8->tail;
    ((*channeluser)->hh_from_channel).prev = (void *)((long)pUVar5 - pUVar8->hho);
    pcVar4 = *channeluser;
    pUVar5->next = pcVar4;
    pUVar8->tail = &pcVar4->hh_from_channel;
    pcVar4 = *channeluser;
  }
  pUVar8->num_items = pUVar8->num_items + 1;
  uVar9 = pUVar8->num_buckets - 1 & uVar9;
  pUVar6 = pUVar8->buckets;
  uVar11 = pUVar6[uVar9].count + 1;
  pUVar6[uVar9].count = uVar11;
  pUVar5 = pUVar6[uVar9].hh_head;
  (pcVar4->hh_from_channel).hh_next = pUVar5;
  ((*channeluser)->hh_from_channel).hh_prev = (UT_hash_handle *)0x0;
  if (pUVar5 != (UT_hash_handle *)0x0) {
    pUVar5->hh_prev = &(*channeluser)->hh_from_channel;
  }
  pUVar6[uVar9].hh_head = &(*channeluser)->hh_from_channel;
  if (pUVar6[uVar9].expand_mult * 10 + 10 <= uVar11) {
    pcVar4 = *channeluser;
    pUVar8 = (pcVar4->hh_from_channel).tbl;
    if (pUVar8->noexpand == 0) {
      uVar9 = pUVar8->num_buckets;
      pUVar6 = (UT_hash_bucket *)calloc(1,(ulong)uVar9 << 5);
      if (pUVar6 == (UT_hash_bucket *)0x0) {
LAB_00102dcf:
        exit(-1);
      }
      pUVar8->ideal_chain_maxlen =
           ((pUVar8->num_items >> ((char)pUVar8->log2_num_buckets + 1U & 0x1f)) + 1) -
           (uint)((uVar9 * 2 - 1 & pUVar8->num_items) == 0);
      pUVar8->nonideal_items = 0;
      if (uVar9 != 0) {
        uVar7 = 0;
        do {
          pUVar5 = pUVar8->buckets[uVar7].hh_head;
          if (pUVar5 != (UT_hash_handle *)0x0) {
            do {
              pUVar8 = ((*channeluser)->hh_from_channel).tbl;
              uVar11 = pUVar8->num_buckets * 2 - 1 & pUVar5->hashv;
              pUVar2 = pUVar5->hh_next;
              pUVar1 = pUVar6 + uVar11;
              uVar9 = pUVar6[uVar11].count + 1;
              pUVar6[uVar11].count = uVar9;
              if (pUVar8->ideal_chain_maxlen < uVar9) {
                pUVar8->nonideal_items = pUVar8->nonideal_items + 1;
                if (pUVar8->ideal_chain_maxlen * pUVar1->expand_mult < uVar9) {
                  pUVar1->expand_mult = pUVar1->expand_mult + 1;
                }
              }
              pUVar5->hh_prev = (UT_hash_handle *)0x0;
              pUVar3 = pUVar1->hh_head;
              pUVar5->hh_next = pUVar3;
              if (pUVar3 != (UT_hash_handle *)0x0) {
                pUVar3->hh_prev = pUVar5;
              }
              pUVar1->hh_head = pUVar5;
              pUVar5 = pUVar2;
            } while (pUVar2 != (UT_hash_handle *)0x0);
            pcVar4 = *channeluser;
          }
          uVar7 = uVar7 + 1;
          pUVar8 = (pcVar4->hh_from_channel).tbl;
        } while (uVar7 < pUVar8->num_buckets);
      }
      free(pUVar8->buckets);
      pUVar8 = ((*channeluser)->hh_from_channel).tbl;
      pUVar8->num_buckets = pUVar8->num_buckets << 1;
      pUVar8->log2_num_buckets = pUVar8->log2_num_buckets + 1;
      pUVar8->buckets = pUVar6;
      pUVar8 = ((*channeluser)->hh_from_channel).tbl;
      if (pUVar8->num_items >> 1 < pUVar8->nonideal_items) {
        uVar9 = pUVar8->ineff_expands + 1;
        pUVar8->ineff_expands = uVar9;
        if (1 < uVar9) {
          pUVar8->noexpand = 1;
        }
      }
      else {
        pUVar8->ineff_expands = 0;
      }
    }
  }
  return true;
}

Assistant:

bool chirc_channeluser_get_or_create(chirc_channel_t *channel, chirc_user_t *user, chirc_channeluser_t **channeluser)
{
    bool created;

    HASH_FIND(hh_from_channel,channel->users, &user,sizeof(chirc_user_t *), *channeluser);
    if(*channeluser)
    {
        created = false;
    }
    else
    {
        created = true;

        *channeluser = malloc(sizeof(chirc_channeluser_t));
        chirc_channeluser_init(*channeluser);
        (*channeluser)->channel = channel;
        (*channeluser)->user = user;
        HASH_ADD(hh_from_user, user->channels, channel, sizeof(chirc_channel_t *), *channeluser);
        HASH_ADD(hh_from_channel, channel->users, user, sizeof(chirc_user_t *), *channeluser);
    }

    return created;
}